

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLineAndFile.hpp
# Opt level: O0

string * __thiscall GrpLineAndFile::FileWithPath(GrpLineAndFile *this,string *staPath)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  undefined1 *puVar4;
  string *in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t ich;
  char chSlash;
  string *staResult;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined8 local_38;
  undefined1 local_2d;
  
  std::__cxx11::string::string(in_RDI);
  bVar1 = std::operator==(in_stack_ffffffffffffff70,
                          (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  if (bVar1) {
    std::__cxx11::string::operator=(in_RDI,(string *)(in_RSI + 8));
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 8);
    if ((*pcVar2 == '/') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 8), *pcVar2 == ':')) {
      std::__cxx11::string::operator=(in_RDI,(string *)(in_RSI + 8));
    }
    else {
      std::__cxx11::string::operator=(in_RDI,in_RDX);
      std::__cxx11::string::append(in_RDI);
    }
  }
  local_2d = 0x2f;
  for (local_38 = 0; uVar3 = std::__cxx11::string::length(), local_38 < uVar3;
      local_38 = local_38 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if ((*pcVar2 == '\\') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI), *pcVar2 == '/')) {
      uVar5 = local_2d;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *puVar4 = uVar5;
    }
  }
  return in_RDI;
}

Assistant:

std::string FileWithPath(std::string staPath) // append the given path unless the file has an absolute path
	{
		std::string staResult;
		if (m_staFile == "")
			staResult = m_staFile;
		else if (m_staFile[0] == '/' || m_staFile[1] == ':') //  / is Linux, C: is Windows
		{
			// Absolute path
			staResult = m_staFile;
		}
		else
		{
			// Relative path
			staResult = staPath;
			staResult.append(m_staFile);
		}

		// Make all the slashes consistent.
#ifdef _WIN32
		char chSlash = '\\';
#else
		char chSlash = '/';
#endif // _WIN32
		for (size_t ich = 0; ich < staResult.length(); ich++)
		{
			if (staResult[ich] == '\\' || staResult[ich] == '/')
				staResult[ich] = chSlash;
		}

		return staResult;
	}